

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall
ot::commissioner::Interpreter::NetworkSelectionComparator::NetworkSelectionComparator
          (NetworkSelectionComparator *this,Interpreter *aInterpreter)

{
  Status SVar1;
  element_type *this_00;
  undefined1 local_78 [7];
  RegistryStatus status;
  Network nwk;
  Interpreter *aInterpreter_local;
  NetworkSelectionComparator *this_local;
  
  this->mInterpreter = aInterpreter;
  nwk._88_8_ = aInterpreter;
  persistent_storage::Network::Network((Network *)local_78);
  this_00 = std::
            __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mInterpreter->mRegistry);
  SVar1 = persistent_storage::Registry::GetCurrentNetwork(this_00,(Network *)local_78);
  this->mSuccess = SVar1 == kSuccess;
  if ((this->mSuccess & 1U) != 0) {
    this->mStartWith = nwk.mName.field_2._8_8_;
  }
  persistent_storage::Network::~Network((Network *)local_78);
  return;
}

Assistant:

Interpreter::NetworkSelectionComparator::NetworkSelectionComparator(const Interpreter &aInterpreter)
    : mInterpreter(aInterpreter)
{
    Network        nwk;
    RegistryStatus status = mInterpreter.mRegistry->GetCurrentNetwork(nwk);

    mSuccess = status == RegistryStatus::kSuccess;
    if (mSuccess)
    {
        mStartWith = nwk.mXpan;
    }
}